

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O0

ostream * tcb::operator<<(ostream *os,rational<short> *r)

{
  value_type_conflict3 vVar1;
  ostream *this;
  rational<short> *r_local;
  ostream *os_local;
  
  vVar1 = rational<short>::num(r);
  std::ostream::operator<<(os,vVar1);
  vVar1 = rational<short>::denom(r);
  if (vVar1 != 1) {
    this = std::operator<<(os,'/');
    vVar1 = rational<short>::denom(r);
    std::ostream::operator<<(this,vVar1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const rational<T>& r)
{
    os << r.num();
    if (r.denom() != 1) {
        os << '/' << r.denom();
    }
    return os;
}